

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Goblin.cpp
# Opt level: O0

void __thiscall Goblin::Defend(Goblin *this,int attackRoll)

{
  int iVar1;
  int damage;
  int defendRoll;
  int attackRoll_local;
  Goblin *this_local;
  
  damage = attackRoll;
  if ((this->cutOpponentTendon & 1U) != 0) {
    damage = attackRoll / 2;
  }
  iVar1 = (*(this->super_Character)._vptr_Character[1])();
  iVar1 = (damage - iVar1) - (this->super_Character).armor;
  if ((0 < iVar1) &&
     ((this->super_Character).currentStrengthPoints =
           (this->super_Character).currentStrengthPoints - iVar1,
     (this->super_Character).currentStrengthPoints < 1)) {
    (this->super_Character).alive = false;
  }
  return;
}

Assistant:

void Goblin::Defend(int attackRoll)
{
    if(cutOpponentTendon)
    {
        attackRoll = (attackRoll / 2);
    }

    int defendRoll = this->RollDefense();
    int damage = attackRoll - defendRoll - armor;

    if(damage > 0)
    {
        currentStrengthPoints -= damage;

        if(currentStrengthPoints <= 0)
        {
            alive = false;
        }
    }
}